

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen2_2x3.cpp
# Opt level: O0

size_t Assimp::STEP::GenericFill<Assimp::IFC::Schema_2x3::IfcSite>(DB *db,LIST *params,IfcSite *in)

{
  size_t sVar1;
  TypeError *this;
  element_type *peVar2;
  long local_308;
  long local_2e0;
  long local_2b8;
  long local_290;
  long local_268;
  TypeError *t_4;
  shared_ptr<const_Assimp::STEP::EXPRESS::DataType> arg_4;
  TypeError *t_3;
  shared_ptr<const_Assimp::STEP::EXPRESS::DataType> arg_3;
  TypeError *t_2;
  shared_ptr<const_Assimp::STEP::EXPRESS::DataType> arg_2;
  TypeError *t_1;
  shared_ptr<const_Assimp::STEP::EXPRESS::DataType> arg_1;
  TypeError *t;
  undefined1 local_70 [8];
  shared_ptr<const_Assimp::STEP::EXPRESS::DataType> arg;
  allocator local_49;
  string local_48;
  size_t local_28;
  size_t base;
  IfcSite *in_local;
  LIST *params_local;
  DB *db_local;
  
  base = (size_t)in;
  in_local = (IfcSite *)params;
  params_local = (LIST *)db;
  local_28 = GenericFill<Assimp::IFC::Schema_2x3::IfcSpatialStructureElement>
                       (db,params,&in->super_IfcSpatialStructureElement);
  sVar1 = EXPRESS::LIST::GetSize((LIST *)in_local);
  if (sVar1 < 0xe) {
    arg.super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._3_1_ = 1;
    this = (TypeError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_48,"expected 14 arguments to IfcSite",&local_49);
    TypeError::TypeError(this,&local_48,0xffffffffffffffff,0xffffffffffffffff);
    arg.super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi._3_1_ = 0;
    __cxa_throw(this,&TypeError::typeinfo,TypeError::~TypeError);
  }
  local_28 = local_28 + 1;
  EXPRESS::LIST::operator[]((LIST *)local_70,(size_t)in_local);
  peVar2 = std::
           __shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_70);
  if (peVar2 == (element_type *)0x0) {
    local_268 = 0;
  }
  else {
    local_268 = __dynamic_cast(peVar2,&EXPRESS::DataType::typeinfo,&EXPRESS::UNSET::typeinfo,0);
  }
  if (local_268 == 0) {
    GenericConvert<Assimp::STEP::Maybe<Assimp::STEP::ListOf<Assimp::STEP::EXPRESS::PrimitiveDataType<long>,3ul,3ul>>>
              ((Maybe<Assimp::STEP::ListOf<Assimp::STEP::EXPRESS::PrimitiveDataType<long>,_3UL,_3UL>_>
                *)(base + 0x168),(shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)local_70,
               (DB *)params_local);
  }
  std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>::~shared_ptr
            ((shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)local_70);
  local_28 = local_28 + 1;
  EXPRESS::LIST::operator[]((LIST *)&t_1,(size_t)in_local);
  peVar2 = std::
           __shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&t_1);
  if (peVar2 == (element_type *)0x0) {
    local_290 = 0;
  }
  else {
    local_290 = __dynamic_cast(peVar2,&EXPRESS::DataType::typeinfo,&EXPRESS::UNSET::typeinfo,0);
  }
  if (local_290 == 0) {
    GenericConvert<Assimp::STEP::Maybe<Assimp::STEP::ListOf<Assimp::STEP::EXPRESS::PrimitiveDataType<long>,3ul,3ul>>>
              ((Maybe<Assimp::STEP::ListOf<Assimp::STEP::EXPRESS::PrimitiveDataType<long>,_3UL,_3UL>_>
                *)(base + 0x188),(shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)&t_1,
               (DB *)params_local);
  }
  std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>::~shared_ptr
            ((shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)&t_1);
  local_28 = local_28 + 1;
  EXPRESS::LIST::operator[]((LIST *)&t_2,(size_t)in_local);
  peVar2 = std::
           __shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&t_2);
  if (peVar2 == (element_type *)0x0) {
    local_2b8 = 0;
  }
  else {
    local_2b8 = __dynamic_cast(peVar2,&EXPRESS::DataType::typeinfo,&EXPRESS::UNSET::typeinfo,0);
  }
  if (local_2b8 == 0) {
    GenericConvert<Assimp::STEP::Maybe<double>>
              ((Maybe<double> *)(base + 0x1a8),
               (shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)&t_2,(DB *)params_local);
  }
  std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>::~shared_ptr
            ((shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)&t_2);
  local_28 = local_28 + 1;
  EXPRESS::LIST::operator[]((LIST *)&t_3,(size_t)in_local);
  peVar2 = std::
           __shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&t_3);
  if (peVar2 == (element_type *)0x0) {
    local_2e0 = 0;
  }
  else {
    local_2e0 = __dynamic_cast(peVar2,&EXPRESS::DataType::typeinfo,&EXPRESS::UNSET::typeinfo,0);
  }
  if (local_2e0 == 0) {
    GenericConvert<Assimp::STEP::Maybe<std::__cxx11::string>>
              ((Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)(base + 0x1b8),(shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)&t_3,
               (DB *)params_local);
  }
  std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>::~shared_ptr
            ((shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)&t_3);
  local_28 = local_28 + 1;
  EXPRESS::LIST::operator[]((LIST *)&t_4,(size_t)in_local);
  peVar2 = std::
           __shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&t_4);
  if (peVar2 == (element_type *)0x0) {
    local_308 = 0;
  }
  else {
    local_308 = __dynamic_cast(peVar2,&EXPRESS::DataType::typeinfo,&EXPRESS::UNSET::typeinfo,0);
  }
  if (local_308 == 0) {
    GenericConvert<Assimp::STEP::Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>>>
              ((Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>_> *)(base + 0x1e0)
               ,(shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)&t_4,(DB *)params_local);
  }
  std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>::~shared_ptr
            ((shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *)&t_4);
  return local_28;
}

Assistant:

size_t GenericFill<IfcSite>(const DB& db, const LIST& params, IfcSite* in)
{
	size_t base = GenericFill(db,params,static_cast<IfcSpatialStructureElement*>(in));
	if (params.GetSize() < 14) { throw STEP::TypeError("expected 14 arguments to IfcSite"); }    do { // convert the 'RefLatitude' argument
        std::shared_ptr<const DataType> arg = params[base++];
        if (dynamic_cast<const UNSET*>(&*arg)) break;
        try { GenericConvert( in->RefLatitude, arg, db ); break; } 
        catch (const TypeError& t) { throw TypeError(t.what() + std::string(" - expected argument 9 to IfcSite to be a `IfcCompoundPlaneAngleMeasure`")); }
    } while(0);
    do { // convert the 'RefLongitude' argument
        std::shared_ptr<const DataType> arg = params[base++];
        if (dynamic_cast<const UNSET*>(&*arg)) break;
        try { GenericConvert( in->RefLongitude, arg, db ); break; } 
        catch (const TypeError& t) { throw TypeError(t.what() + std::string(" - expected argument 10 to IfcSite to be a `IfcCompoundPlaneAngleMeasure`")); }
    } while(0);
    do { // convert the 'RefElevation' argument
        std::shared_ptr<const DataType> arg = params[base++];
        if (dynamic_cast<const UNSET*>(&*arg)) break;
        try { GenericConvert( in->RefElevation, arg, db ); break; } 
        catch (const TypeError& t) { throw TypeError(t.what() + std::string(" - expected argument 11 to IfcSite to be a `IfcLengthMeasure`")); }
    } while(0);
    do { // convert the 'LandTitleNumber' argument
        std::shared_ptr<const DataType> arg = params[base++];
        if (dynamic_cast<const UNSET*>(&*arg)) break;
        try { GenericConvert( in->LandTitleNumber, arg, db ); break; } 
        catch (const TypeError& t) { throw TypeError(t.what() + std::string(" - expected argument 12 to IfcSite to be a `IfcLabel`")); }
    } while(0);
    do { // convert the 'SiteAddress' argument
        std::shared_ptr<const DataType> arg = params[base++];
        if (dynamic_cast<const UNSET*>(&*arg)) break;
        try { GenericConvert( in->SiteAddress, arg, db ); break; } 
        catch (const TypeError& t) { throw TypeError(t.what() + std::string(" - expected argument 13 to IfcSite to be a `IfcPostalAddress`")); }
    } while(0);
	return base;
}